

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readCStyleComment(OurReader *this)

{
  Char CVar1;
  OurReader *in_RDI;
  Char c;
  
  do {
    if (in_RDI->end_ <= in_RDI->current_ + 1) break;
    CVar1 = getNextChar(in_RDI);
  } while ((CVar1 != '*') || (*in_RDI->current_ != '/'));
  CVar1 = getNextChar(in_RDI);
  return CVar1 == '/';
}

Assistant:

bool OurReader::readCStyleComment() {
  while ((current_ + 1) < end_) {
    Char c = getNextChar();
    if (c == '*' && *current_ == '/')
      break;
  }
  return getNextChar() == '/';
}